

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_settable_totop(lua_State *L,CallInfo *ci,TValue *ra,TValue *first_val,int start)

{
  LuaType LVar1;
  Table *t;
  RaviArray *t_00;
  lua_Integer value;
  uint nasize;
  char *pcVar2;
  uint ukey;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  TValue *pTVar6;
  double dVar7;
  lua_Number value_00;
  undefined1 auVar8 [16];
  
  LVar1 = ra->tt_;
  uVar3 = (uint)((ulong)((long)L->top - (long)first_val) >> 4);
  if ((LVar1 == 0x8025) || (LVar1 == 0x8015)) {
    t_00 = (RaviArray *)(ra->value_).gc;
    if ((t_00->tt != '\x15') && (t_00->tt != '%')) {
      pcVar2 = 
      "((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_00149c05;
    }
    if (0 < (int)uVar3) {
      uVar4 = (ulong)start;
      pTVar6 = first_val + (uVar4 - 1);
      do {
        LVar1 = pTVar6->tt_;
        if ((t_00->flags & 8) == 0) {
          if (LVar1 == 3) {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = (pTVar6->value_).n;
            auVar8 = vroundsd_avx(auVar8,auVar8,9);
            dVar7 = auVar8._0_8_;
            if (((dVar7 == (pTVar6->value_).n) && (-9.223372036854776e+18 <= dVar7)) &&
               (dVar7 < 9.223372036854776e+18)) {
              value = (lua_Integer)dVar7;
              goto LAB_00149b53;
            }
          }
          else if (LVar1 == 0x13) {
            value = (pTVar6->value_).i;
LAB_00149b53:
            if ((uint)uVar4 < t_00->len) {
              *(lua_Integer *)(t_00->data + (uVar4 & 0xffffffff) * 8) = value;
            }
            else {
              raviH_set_int(L,t_00,uVar4 & 0xffffffff,value);
            }
            goto LAB_00149b9d;
          }
          pcVar2 = "value cannot be converted to integer";
LAB_00149bcc:
          luaG_runerror(L,pcVar2);
        }
        if (LVar1 == 0x13) {
          value_00 = (lua_Number)(pTVar6->value_).i;
        }
        else {
          if (LVar1 != 3) {
            pcVar2 = "value cannot be converted to number";
            goto LAB_00149bcc;
          }
          value_00 = (pTVar6->value_).n;
        }
        if ((uint)uVar4 < t_00->len) {
          *(lua_Number *)(t_00->data + (uVar4 & 0xffffffff) * 8) = value_00;
        }
        else {
          raviH_set_float(L,t_00,uVar4 & 0xffffffff,value_00);
        }
LAB_00149b9d:
        uVar4 = uVar4 + 1;
        pTVar6 = pTVar6 + 1;
      } while ((long)uVar4 < (long)(int)(uVar3 + start));
    }
  }
  else {
    if (LVar1 != 0x8005) {
      pcVar2 = 
      "(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_00149c05:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb43,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    t = (Table *)(ra->value_).gc;
    if (t->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb39,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    nasize = (uVar3 - 1) + start;
    if (t->sizearray < nasize) {
      luaH_resizearray(L,t,nasize);
    }
    if (0 < (int)uVar3) {
      lVar5 = (ulong)(uVar3 & 0x7fffffff) + 1;
      pTVar6 = first_val + ((ulong)(uVar3 & 0x7fffffff) - 1);
      do {
        luaH_setint(L,t,(ulong)nasize,pTVar6);
        if ((short)pTVar6->tt_ < 0) {
          if (9 < (t->tt & 0xe)) {
            __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb3f,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          if (((t->marked & 0x20) != 0) && ((((pTVar6->value_).gc)->marked & 0x18) != 0)) {
            luaC_barrierback_(L,(GCObject *)t);
          }
        }
        lVar5 = lVar5 + -1;
        pTVar6 = pTVar6 + -1;
        nasize = nasize - 1;
      } while (1 < lVar5);
    }
  }
  return;
}

Assistant:

void raviV_op_settable_totop(lua_State *L, CallInfo *ci, TValue *ra, TValue *first_val, int start) {
  unsigned int last;
  int n = cast_int(L->top - first_val);
  last = start + n - 1;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = first_val + n - 1;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = start;
    for (; i <= (int)last; i++) {
      TValue *val = first_val + i - 1;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  //L->top = ci->top; /* correct top (in case of previous open call) */
}